

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.cc
# Opt level: O0

int pkcs7_bundle_raw_certificates_cb(CBB *out,void *arg)

{
  int iVar1;
  CRYPTO_BUFFER *pCVar2;
  uint8_t *data;
  size_t len;
  bool local_79;
  CRYPTO_BUFFER *cert;
  size_t i;
  CBB certificates;
  stack_st_CRYPTO_BUFFER *certs;
  void *arg_local;
  CBB *out_local;
  
  certificates.u._24_8_ = arg;
  iVar1 = CBB_add_asn1(out,(CBB *)&i,0xa0000000);
  if (iVar1 == 0) {
    out_local._4_4_ = 0;
  }
  else {
    for (cert = (CRYPTO_BUFFER *)0x0;
        pCVar2 = (CRYPTO_BUFFER *)
                 sk_CRYPTO_BUFFER_num((stack_st_CRYPTO_BUFFER *)certificates.u._24_8_),
        cert < pCVar2; cert = (CRYPTO_BUFFER *)((long)&cert->pool + 1)) {
      pCVar2 = sk_CRYPTO_BUFFER_value((stack_st_CRYPTO_BUFFER *)certificates.u._24_8_,(size_t)cert);
      data = CRYPTO_BUFFER_data(pCVar2);
      len = CRYPTO_BUFFER_len(pCVar2);
      iVar1 = CBB_add_bytes((CBB *)&i,data,len);
      if (iVar1 == 0) {
        return 0;
      }
    }
    iVar1 = CBB_flush_asn1_set_of((CBB *)&i);
    local_79 = false;
    if (iVar1 != 0) {
      iVar1 = CBB_flush(out);
      local_79 = iVar1 != 0;
    }
    out_local._4_4_ = (uint)local_79;
  }
  return out_local._4_4_;
}

Assistant:

static int pkcs7_bundle_raw_certificates_cb(CBB *out, void *arg) {
  const STACK_OF(CRYPTO_BUFFER) *certs =
      reinterpret_cast<const STACK_OF(CRYPTO_BUFFER) *>(arg);
  CBB certificates;

  // See https://tools.ietf.org/html/rfc2315#section-9.1
  if (!CBB_add_asn1(out, &certificates,
                    CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0)) {
    return 0;
  }

  for (size_t i = 0; i < sk_CRYPTO_BUFFER_num(certs); i++) {
    CRYPTO_BUFFER *cert = sk_CRYPTO_BUFFER_value(certs, i);
    if (!CBB_add_bytes(&certificates, CRYPTO_BUFFER_data(cert),
                       CRYPTO_BUFFER_len(cert))) {
      return 0;
    }
  }

  // |certificates| is a implicitly-tagged SET OF.
  return CBB_flush_asn1_set_of(&certificates) && CBB_flush(out);
}